

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O2

hugeint_t __thiscall
duckdb::DecimalScaleDownOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t>
          (DecimalScaleDownOperator *this,hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr
          )

{
  bool bVar1;
  hugeint_t hVar2;
  hugeint_t input_00;
  hugeint_t hStack_48;
  hugeint_t input_local;
  hugeint_t scaling;
  
  input_local.upper = input.lower;
  input_local.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&hStack_48,2);
  scaling = hugeint_t::operator/((hugeint_t *)(idx + 0x30),&hStack_48);
  hugeint_t::operator/=(&input_local,&scaling);
  hugeint_t::hugeint_t(&hStack_48,0);
  bVar1 = hugeint_t::operator<(&input_local,&hStack_48);
  if (bVar1) {
    hugeint_t::hugeint_t(&hStack_48,1);
    hugeint_t::operator-=(&input_local,&hStack_48);
  }
  else {
    hugeint_t::hugeint_t(&hStack_48,1);
    hugeint_t::operator+=(&input_local,&hStack_48);
  }
  hugeint_t::hugeint_t(&hStack_48,2);
  hVar2 = hugeint_t::operator/(&input_local,&hStack_48);
  input_00.upper = hVar2.upper;
  input_00.lower = input_00.upper;
  hVar2 = Cast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>((Cast *)hVar2.lower,input_00);
  return hVar2;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		//	We need to round here, not truncate.
		auto data = (DecimalScaleInput<INPUT_TYPE> *)dataptr;
		//	Scale first so we don't overflow when rounding.
		const auto scaling = data->factor / 2;
		input /= scaling;
		if (input < 0) {
			input -= 1;
		} else {
			input += 1;
		}
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input / 2);
	}